

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Env * leveldb::NewMemEnv(Env *base_env)

{
  InMemoryEnv *this;
  Env *base_env_local;
  
  this = (InMemoryEnv *)operator_new(0x68);
  anon_unknown_2::InMemoryEnv::InMemoryEnv(this,base_env);
  return (Env *)this;
}

Assistant:

Env* NewMemEnv(Env* base_env) { return new InMemoryEnv(base_env); }